

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  DescriptorPool *this_00;
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  FileDescriptor *pFVar5;
  string_view local_78;
  once_flag *local_68;
  char *name;
  once_flag *poStack_58;
  int i;
  char *names_ptr;
  byte local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  FileDescriptor *local_10;
  FileDescriptor *this_local;
  
  local_39 = 0;
  local_10 = this;
  if ((this->finished_building_ & 1U) != 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"finished_building_ == true");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x25f2,local_38._M_len,local_38._M_str);
    local_39 = 1;
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  poStack_58 = this->dependencies_once_ + 1;
  for (name._4_4_ = 0; iVar1 = name._4_4_, iVar2 = dependency_count(this), iVar1 < iVar2;
      name._4_4_ = name._4_4_ + 1) {
    local_68 = poStack_58;
    sVar4 = strlen((char *)poStack_58);
    poStack_58 = (once_flag *)
                 ((long)&(poStack_58->control_).super___atomic_base<unsigned_int>._M_i + sVar4 + 1);
    if ((char)(local_68->control_).super___atomic_base<unsigned_int>._M_i != '\0') {
      this_00 = this->pool_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,(char *)local_68);
      pFVar5 = DescriptorPool::FindFileByName(this_00,local_78);
      this->dependencies_[name._4_4_] = pFVar5;
    }
  }
  return;
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  ABSL_CHECK(finished_building_ == true);
  const char* names_ptr = reinterpret_cast<const char*>(dependencies_once_ + 1);
  for (int i = 0; i < dependency_count(); i++) {
    const char* name = names_ptr;
    names_ptr += strlen(name) + 1;
    if (name[0] != '\0') {
      dependencies_[i] = pool_->FindFileByName(name);
    }
  }
}